

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O3

void secp256k1_scalar_reduce_512(secp256k1_scalar *r,uint32_t *l)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  long lVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  bool bVar40;
  uint uVar18;
  uint uVar34;
  
  uVar6 = l[8];
  uVar2 = (ulong)uVar6;
  uVar13 = l[9];
  uVar8 = (ulong)uVar13;
  uVar24 = (uint)(uVar2 * 0x2fc9bebf);
  uVar3 = (int)(uVar2 * 0x2fc9bebf >> 0x20) + l[1] + (uint)CARRY4(uVar24,*l);
  uVar1 = (uint)(uVar8 * 0x2fc9bebf);
  uVar20 = uVar1 + uVar3;
  uVar5 = l[10];
  uVar11 = (ulong)uVar5;
  uVar21 = (uint)(uVar2 * 0x402da173);
  uVar31 = uVar21 + uVar20;
  uVar20 = (int)(uVar2 * 0x402da173 >> 0x20) + (int)(uVar8 * 0x2fc9bebf >> 0x20) + l[2] +
           (uint)(uVar3 < l[1]) + (uint)CARRY4(uVar1,uVar3) + (uint)CARRY4(uVar21,uVar20);
  uVar3 = l[0xb];
  uVar23 = (ulong)uVar3;
  uVar9 = (uint)(uVar11 * 0x2fc9bebf);
  uVar21 = uVar9 + uVar20;
  uVar22 = (uint)(uVar8 * 0x402da173);
  uVar26 = uVar22 + uVar21;
  uVar1 = (uint)(uVar2 * 0x50b75fc4);
  uVar4 = uVar1 + uVar26;
  uVar21 = (uint)CARRY4(uVar22,uVar21) +
           (int)(uVar11 * 0x2fc9bebf >> 0x20) + l[3] +
           (int)(uVar2 * 0x50b75fc4 >> 0x20) + (int)(uVar8 * 0x402da173 >> 0x20) +
           (uint)(uVar20 < l[2]) + (uint)CARRY4(uVar9,uVar20) + (uint)CARRY4(uVar1,uVar26);
  uVar26 = (uint)(uVar23 * 0x2fc9bebf);
  uVar27 = uVar26 + uVar21;
  uVar9 = (uint)(uVar11 * 0x402da173);
  uVar22 = uVar9 + uVar27;
  uVar20 = (uint)(uVar8 * 0x50b75fc4);
  uVar1 = uVar20 + uVar22;
  uVar26 = (uint)CARRY4(uVar9,uVar27) +
           (int)(uVar8 * 0x50b75fc4 >> 0x20) + (int)(uVar11 * 0x402da173 >> 0x20) +
           (int)(uVar23 * 0x2fc9bebf >> 0x20) + (uint)(uVar21 < l[3]) + (uint)CARRY4(uVar26,uVar21)
           + (uint)CARRY4(uVar20,uVar22);
  uVar20 = l[0xc];
  uVar10 = (ulong)uVar20;
  uVar21 = (uint)(uVar2 * 0x45512319);
  uVar36 = uVar21 + uVar1;
  uVar1 = (uint)CARRY4(uVar21,uVar1);
  uVar15 = (uint)(uVar2 * 0x45512319 >> 0x20);
  uVar21 = uVar26 + uVar15;
  uVar27 = uVar21 + uVar1;
  uVar14 = uVar27 + l[4];
  uVar22 = (uint)(uVar10 * 0x2fc9bebf);
  uVar9 = uVar22 + uVar14;
  uVar16 = (uint)(uVar23 * 0x402da173);
  uVar30 = uVar16 + uVar9;
  uVar28 = (uint)(uVar11 * 0x50b75fc4);
  uVar27 = (uint)CARRY4(uVar16,uVar9) +
           (uint)CARRY4(uVar27,l[4]) +
           (int)(uVar10 * 0x2fc9bebf >> 0x20) +
           (int)(uVar11 * 0x50b75fc4 >> 0x20) + (int)(uVar23 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar26,uVar15) || CARRY4(uVar21,uVar1)) + (uint)CARRY4(uVar22,uVar14) +
           (uint)CARRY4(uVar28,uVar30);
  lVar35 = uVar8 * 0x45512319 + (ulong)(uVar28 + uVar30);
  uVar21 = (uint)lVar35;
  uVar14 = (uint)((ulong)lVar35 >> 0x20);
  uVar1 = l[0xd];
  uVar19 = (ulong)uVar1;
  uVar37 = uVar21 + uVar6;
  uVar6 = (uint)CARRY4(uVar21,uVar6);
  uVar21 = uVar14 + uVar27;
  uVar15 = uVar21 + uVar6;
  uVar16 = uVar15 + l[5];
  uVar26 = (uint)(uVar19 * 0x2fc9bebf);
  uVar22 = uVar26 + uVar16;
  uVar30 = (uint)(uVar10 * 0x402da173);
  uVar32 = uVar30 + uVar22;
  uVar9 = (uint)(uVar23 * 0x50b75fc4);
  uVar28 = (uint)CARRY4(uVar30,uVar22) +
           (uint)CARRY4(uVar15,l[5]) +
           (int)(uVar19 * 0x2fc9bebf >> 0x20) +
           (int)(uVar23 * 0x50b75fc4 >> 0x20) + (int)(uVar10 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar14,uVar27) || CARRY4(uVar21,uVar6)) + (uint)CARRY4(uVar26,uVar16) +
           (uint)CARRY4(uVar9,uVar32);
  lVar35 = uVar11 * 0x45512319 + (ulong)(uVar9 + uVar32);
  uVar21 = (uint)lVar35;
  uVar15 = (uint)((ulong)lVar35 >> 0x20);
  uVar6 = l[0xe];
  uVar2 = (ulong)uVar6;
  uVar38 = uVar21 + uVar13;
  uVar13 = (uint)CARRY4(uVar21,uVar13);
  uVar21 = uVar15 + uVar28;
  uVar16 = uVar21 + uVar13;
  uVar30 = uVar16 + l[6];
  uVar9 = (uint)(uVar2 * 0x2fc9bebf);
  uVar22 = uVar9 + uVar30;
  uVar26 = (uint)(uVar19 * 0x402da173);
  uVar27 = uVar26 + uVar22;
  uVar14 = (uint)(uVar10 * 0x50b75fc4);
  uVar28 = (uint)CARRY4(uVar26,uVar22) +
           (uint)CARRY4(uVar16,l[6]) +
           (int)(uVar2 * 0x2fc9bebf >> 0x20) +
           (int)(uVar10 * 0x50b75fc4 >> 0x20) + (int)(uVar19 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar15,uVar28) || CARRY4(uVar21,uVar13)) + (uint)CARRY4(uVar9,uVar30) +
           (uint)CARRY4(uVar14,uVar27);
  lVar35 = uVar23 * 0x45512319 + (ulong)(uVar14 + uVar27);
  uVar21 = (uint)lVar35;
  uVar15 = (uint)((ulong)lVar35 >> 0x20);
  uVar13 = l[0xf];
  uVar8 = (ulong)uVar13;
  uVar39 = uVar21 + uVar5;
  uVar5 = (uint)CARRY4(uVar21,uVar5);
  uVar21 = uVar15 + uVar28;
  uVar16 = uVar21 + uVar5;
  uVar30 = uVar16 + l[7];
  uVar22 = (uint)(uVar8 * 0x2fc9bebf);
  uVar9 = uVar22 + uVar30;
  uVar27 = (uint)(uVar2 * 0x402da173);
  uVar26 = uVar27 + uVar9;
  uVar14 = (uint)(uVar19 * 0x50b75fc4);
  uVar29 = (uint)CARRY4(uVar27,uVar9) +
           (uint)CARRY4(uVar16,l[7]) +
           (int)(uVar8 * 0x2fc9bebf >> 0x20) +
           (int)(uVar19 * 0x50b75fc4 >> 0x20) + (int)(uVar2 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar15,uVar28) || CARRY4(uVar21,uVar5)) + (uint)CARRY4(uVar22,uVar30) +
           (uint)CARRY4(uVar14,uVar26);
  lVar35 = uVar10 * 0x45512319 + (ulong)(uVar14 + uVar26);
  uVar5 = (uint)lVar35;
  uVar15 = (uint)((ulong)lVar35 >> 0x20);
  uVar14 = (uint)(uVar8 * 0x50b75fc4);
  uVar27 = uVar5 + uVar3;
  uVar5 = (uint)CARRY4(uVar5,uVar3);
  uVar3 = uVar15 + uVar29;
  uVar16 = uVar3 + uVar5;
  uVar21 = (uint)(uVar8 * 0x402da173);
  uVar30 = uVar16 + uVar21;
  uVar28 = (uint)(uVar2 * 0x50b75fc4);
  uVar32 = uVar28 + uVar30;
  uVar22 = (uint)(uVar19 * 0x45512319);
  uVar9 = uVar22 + uVar32;
  uVar26 = uVar9 + uVar20;
  uVar10 = (ulong)uVar26;
  uVar5 = (uint)CARRY4(uVar22,uVar32) +
          (uint)CARRY4(uVar16,uVar21) +
          (int)(uVar8 * 0x402da173 >> 0x20) +
          (int)(uVar19 * 0x45512319 >> 0x20) + (int)(uVar2 * 0x50b75fc4 >> 0x20) + uVar14 +
          (uint)(CARRY4(uVar15,uVar29) || CARRY4(uVar3,uVar5)) + (uint)CARRY4(uVar28,uVar30) +
          (uint)CARRY4(uVar9,uVar20);
  uVar20 = (uint)(uVar2 * 0x45512319);
  uVar3 = uVar20 + uVar5;
  uVar21 = (uint)(uVar8 * 0x45512319);
  uVar15 = uVar3 + uVar1;
  uVar11 = (ulong)uVar15;
  uVar5 = (int)(uVar2 * 0x45512319 >> 0x20) + uVar21 + (int)(uVar8 * 0x50b75fc4 >> 0x20) +
          (uint)(uVar5 < uVar14) + (uint)CARRY4(uVar20,uVar5) + (uint)CARRY4(uVar3,uVar1);
  uVar28 = uVar5 + uVar6;
  uVar19 = (ulong)uVar28;
  uVar32 = (int)(uVar8 * 0x145512319 >> 0x20) + (uint)(uVar5 < uVar21) + (uint)CARRY4(uVar5,uVar6);
  uVar8 = (ulong)uVar32;
  uVar2 = uVar10 * 0x2fc9bebf + CONCAT44(uVar31,uVar24 + *l);
  uVar6 = (uint)(uVar2 >> 0x20);
  uVar5 = (uint)(uVar11 * 0x2fc9bebf);
  uVar1 = uVar5 + uVar6;
  uVar16 = (uint)(uVar10 * 0x402da173);
  uVar6 = (int)(uVar10 * 0x402da173 >> 0x20) + uVar4 + (uint)(uVar6 < uVar31) +
          (int)(uVar11 * 0x2fc9bebf >> 0x20) + (uint)CARRY4(uVar5,uVar6) +
          (uint)CARRY4(uVar16,uVar1);
  uVar3 = (uint)(uVar19 * 0x2fc9bebf);
  uVar5 = uVar3 + uVar6;
  uVar20 = (uint)(uVar11 * 0x402da173);
  uVar30 = uVar20 + uVar5;
  uVar22 = (uint)(uVar10 * 0x50b75fc4);
  uVar5 = (uint)CARRY4(uVar20,uVar5) +
          (int)(uVar11 * 0x402da173 >> 0x20) + (int)(uVar10 * 0x50b75fc4 >> 0x20) + uVar36 +
          (int)(uVar19 * 0x2fc9bebf >> 0x20) + (uint)(uVar6 < uVar4) + (uint)CARRY4(uVar3,uVar6) +
          (uint)CARRY4(uVar22,uVar30);
  uVar9 = (uint)(uVar8 * 0x2fc9bebf);
  uVar24 = uVar9 + uVar5;
  uVar21 = (uint)(uVar19 * 0x402da173);
  uVar3 = uVar21 + uVar24;
  uVar6 = (uint)(uVar11 * 0x50b75fc4);
  uVar20 = uVar6 + uVar3;
  uVar21 = (uint)CARRY4(uVar21,uVar24) +
           (int)(uVar11 * 0x50b75fc4 >> 0x20) + (int)(uVar19 * 0x402da173 >> 0x20) +
           (int)(uVar8 * 0x2fc9bebf >> 0x20) + (uint)(uVar5 < uVar36) + (uint)CARRY4(uVar9,uVar5) +
           (uint)CARRY4(uVar6,uVar3);
  uVar4 = (uint)(uVar10 * 0x45512319);
  uVar6 = (uint)CARRY4(uVar4,uVar20);
  uVar14 = (uint)(uVar10 * 0x45512319 >> 0x20);
  uVar5 = uVar21 + uVar14;
  uVar24 = uVar5 + uVar6;
  uVar9 = uVar24 + uVar37;
  bVar40 = uVar13 <= uVar32;
  uVar3 = 0x2fc9bebf;
  if (bVar40) {
    uVar3 = 0;
  }
  uVar29 = 0x402da173;
  if (bVar40) {
    uVar29 = 0;
  }
  uVar31 = 0x50b75fc4;
  if (bVar40) {
    uVar31 = 0;
  }
  uVar12 = uVar3 + uVar9;
  uVar34 = (uint)(uVar8 * 0x402da173);
  uVar33 = uVar34 + uVar12;
  uVar18 = (uint)(uVar19 * 0x50b75fc4);
  uVar17 = uVar18 + uVar33;
  uVar7 = (uint)(uVar11 * 0x45512319);
  uVar36 = uVar7 + uVar17;
  uVar3 = (uint)CARRY4(uVar7,uVar17) +
          (uint)CARRY4(uVar34,uVar12) +
          (uint)CARRY4(uVar24,uVar37) +
          (int)(uVar8 * 0x402da173 >> 0x20) +
          (int)(uVar19 * 0x50b75fc4 >> 0x20) + (int)(uVar11 * 0x45512319 >> 0x20) + uVar38 +
          (uint)(CARRY4(uVar21,uVar14) || CARRY4(uVar5,uVar6)) + (uint)CARRY4(uVar3,uVar9) +
          (uint)CARRY4(uVar18,uVar33) + (uint)CARRY4(uVar36,uVar26);
  uVar21 = (uint)(uVar8 * 0x50b75fc4);
  uVar24 = uVar21 + uVar29 + uVar3;
  uVar5 = (uint)(uVar19 * 0x45512319);
  uVar6 = uVar5 + uVar24;
  uVar21 = (uint)CARRY4(uVar5,uVar24) +
           uVar39 + (int)(uVar19 * 0x45512319 >> 0x20) + (int)(uVar8 * 0x50b75fc4 >> 0x20) +
           (uint)(uVar3 < uVar38) + (uint)CARRY4(uVar29,uVar3) + (uint)CARRY4(uVar21,uVar29 + uVar3)
           + (uint)CARRY4(uVar6,uVar15);
  uVar5 = (uint)(uVar8 * 0x45512319);
  uVar3 = uVar5 + uVar21 + uVar31;
  uVar21 = (uint)CARRY4(uVar5,uVar21 + uVar31) +
           uVar27 + (int)(uVar8 * 0x45512319 >> 0x20) + (uint)(uVar21 < uVar39) +
           (uint)CARRY4(uVar21,uVar31) + (uint)CARRY4(uVar3,uVar28);
  uVar5 = 0x45512319;
  if (uVar32 >= uVar13) {
    uVar5 = 0;
  }
  lVar35 = (ulong)CARRY4(uVar5,uVar21) + (ulong)(uVar21 < uVar27) + (ulong)(uVar32 < uVar13) +
           (ulong)CARRY4(uVar5 + uVar21,uVar32);
  uVar23 = lVar35 * 0x2fc9bebf + (uVar2 & 0xffffffff);
  uVar25 = lVar35 * 0x402da173 + (ulong)(uVar16 + uVar1) + (uVar23 >> 0x20);
  uVar11 = lVar35 * 0x50b75fc4 + (ulong)(uVar22 + uVar30) + (uVar25 >> 0x20);
  uVar2 = lVar35 * 0x45512319 + (ulong)(uVar4 + uVar20) + (uVar11 >> 0x20);
  uVar8 = (ulong)(uVar36 + uVar26) + lVar35 + (uVar2 >> 0x20);
  uVar10 = (ulong)(uVar6 + uVar15) + (uVar8 >> 0x20);
  uVar19 = (ulong)(uVar3 + uVar28) + (uVar10 >> 0x20);
  lVar35 = (ulong)(uVar5 + uVar21 + uVar32) + (uVar19 >> 0x20);
  uVar13 = (uint)lVar35;
  uVar6 = (uint)((uint)uVar8 < 0xfffffffe || ((uint)uVar19 & (uint)uVar10 & uVar13) != 0xffffffff);
  uVar5 = uVar6 ^ 1;
  if ((uint)uVar8 != 0xffffffff) {
    uVar5 = 0;
  }
  uVar3 = uVar5 ^ 1;
  if (0xbaaedce5 < (uint)uVar2) {
    uVar3 = 0;
  }
  uVar3 = uVar3 | uVar6;
  uVar6 = uVar3 ^ 1;
  if ((uint)uVar2 < 0xbaaedce7) {
    uVar6 = 0;
  }
  uVar20 = (uVar6 | uVar5) ^ 1;
  if (0xaf48a03a < (uint)uVar11) {
    uVar20 = 0;
  }
  uVar20 = uVar20 | uVar3;
  uVar3 = uVar20 ^ 1;
  if ((uint)uVar11 < 0xaf48a03c) {
    uVar3 = 0;
  }
  uVar3 = uVar3 | uVar6 | uVar5;
  uVar6 = ~uVar3;
  if (0xbfd25e8b < (uint)uVar25) {
    uVar6 = 0xbfd25e8c;
  }
  uVar20 = ~(uVar6 | uVar20);
  uVar5 = (uint)uVar23;
  uVar6 = 0xd0364140 < uVar5 & uVar20;
  if (0xbfd25e8c < (uint)uVar25) {
    uVar6 = uVar20 & 1;
  }
  uVar6 = (int)((ulong)lVar35 >> 0x20) + (uVar6 | uVar3);
  r->d[0] = uVar6 * 0x2fc9bebf + uVar5;
  uVar23 = (ulong)(uVar6 * 0x402da173) + (uVar25 & 0xffffffff) +
           (ulong)CARRY4(uVar6 * 0x2fc9bebf,uVar5);
  r->d[1] = (uint32_t)uVar23;
  uVar11 = (ulong)(uVar6 * 0x50b75fc4) + (uVar11 & 0xffffffff) + (uVar23 >> 0x20);
  r->d[2] = (uint32_t)uVar11;
  uVar2 = (ulong)(uVar6 * 0x45512319) + (uVar2 & 0xffffffff) + (uVar11 >> 0x20);
  r->d[3] = (uint32_t)uVar2;
  uVar2 = (ulong)uVar6 + (uVar8 & 0xffffffff) + (uVar2 >> 0x20);
  r->d[4] = (uint32_t)uVar2;
  uVar2 = (uVar10 & 0xffffffff) + (uVar2 >> 0x20);
  r->d[5] = (uint32_t)uVar2;
  lVar35 = (uVar19 & 0xffffffff) + (uVar2 >> 0x20);
  r->d[6] = (uint32_t)lVar35;
  r->d[7] = (int)((ulong)lVar35 >> 0x20) + uVar13;
  return;
}

Assistant:

static void secp256k1_scalar_reduce_512(secp256k1_scalar *r, const uint32_t *l) {
    uint64_t c;
    uint32_t n0 = l[8], n1 = l[9], n2 = l[10], n3 = l[11], n4 = l[12], n5 = l[13], n6 = l[14], n7 = l[15];
    uint32_t m0, m1, m2, m3, m4, m5, m6, m7, m8, m9, m10, m11, m12;
    uint32_t p0, p1, p2, p3, p4, p5, p6, p7, p8;

    /* 96 bit accumulator. */
    uint32_t c0, c1, c2;

    /* Reduce 512 bits into 385. */
    /* m[0..12] = l[0..7] + n[0..7] * SECP256K1_N_C. */
    c0 = l[0]; c1 = 0; c2 = 0;
    muladd_fast(n0, SECP256K1_N_C_0);
    extract_fast(m0);
    sumadd_fast(l[1]);
    muladd(n1, SECP256K1_N_C_0);
    muladd(n0, SECP256K1_N_C_1);
    extract(m1);
    sumadd(l[2]);
    muladd(n2, SECP256K1_N_C_0);
    muladd(n1, SECP256K1_N_C_1);
    muladd(n0, SECP256K1_N_C_2);
    extract(m2);
    sumadd(l[3]);
    muladd(n3, SECP256K1_N_C_0);
    muladd(n2, SECP256K1_N_C_1);
    muladd(n1, SECP256K1_N_C_2);
    muladd(n0, SECP256K1_N_C_3);
    extract(m3);
    sumadd(l[4]);
    muladd(n4, SECP256K1_N_C_0);
    muladd(n3, SECP256K1_N_C_1);
    muladd(n2, SECP256K1_N_C_2);
    muladd(n1, SECP256K1_N_C_3);
    sumadd(n0);
    extract(m4);
    sumadd(l[5]);
    muladd(n5, SECP256K1_N_C_0);
    muladd(n4, SECP256K1_N_C_1);
    muladd(n3, SECP256K1_N_C_2);
    muladd(n2, SECP256K1_N_C_3);
    sumadd(n1);
    extract(m5);
    sumadd(l[6]);
    muladd(n6, SECP256K1_N_C_0);
    muladd(n5, SECP256K1_N_C_1);
    muladd(n4, SECP256K1_N_C_2);
    muladd(n3, SECP256K1_N_C_3);
    sumadd(n2);
    extract(m6);
    sumadd(l[7]);
    muladd(n7, SECP256K1_N_C_0);
    muladd(n6, SECP256K1_N_C_1);
    muladd(n5, SECP256K1_N_C_2);
    muladd(n4, SECP256K1_N_C_3);
    sumadd(n3);
    extract(m7);
    muladd(n7, SECP256K1_N_C_1);
    muladd(n6, SECP256K1_N_C_2);
    muladd(n5, SECP256K1_N_C_3);
    sumadd(n4);
    extract(m8);
    muladd(n7, SECP256K1_N_C_2);
    muladd(n6, SECP256K1_N_C_3);
    sumadd(n5);
    extract(m9);
    muladd(n7, SECP256K1_N_C_3);
    sumadd(n6);
    extract(m10);
    sumadd_fast(n7);
    extract_fast(m11);
    VERIFY_CHECK(c0 <= 1);
    m12 = c0;

    /* Reduce 385 bits into 258. */
    /* p[0..8] = m[0..7] + m[8..12] * SECP256K1_N_C. */
    c0 = m0; c1 = 0; c2 = 0;
    muladd_fast(m8, SECP256K1_N_C_0);
    extract_fast(p0);
    sumadd_fast(m1);
    muladd(m9, SECP256K1_N_C_0);
    muladd(m8, SECP256K1_N_C_1);
    extract(p1);
    sumadd(m2);
    muladd(m10, SECP256K1_N_C_0);
    muladd(m9, SECP256K1_N_C_1);
    muladd(m8, SECP256K1_N_C_2);
    extract(p2);
    sumadd(m3);
    muladd(m11, SECP256K1_N_C_0);
    muladd(m10, SECP256K1_N_C_1);
    muladd(m9, SECP256K1_N_C_2);
    muladd(m8, SECP256K1_N_C_3);
    extract(p3);
    sumadd(m4);
    muladd(m12, SECP256K1_N_C_0);
    muladd(m11, SECP256K1_N_C_1);
    muladd(m10, SECP256K1_N_C_2);
    muladd(m9, SECP256K1_N_C_3);
    sumadd(m8);
    extract(p4);
    sumadd(m5);
    muladd(m12, SECP256K1_N_C_1);
    muladd(m11, SECP256K1_N_C_2);
    muladd(m10, SECP256K1_N_C_3);
    sumadd(m9);
    extract(p5);
    sumadd(m6);
    muladd(m12, SECP256K1_N_C_2);
    muladd(m11, SECP256K1_N_C_3);
    sumadd(m10);
    extract(p6);
    sumadd_fast(m7);
    muladd_fast(m12, SECP256K1_N_C_3);
    sumadd_fast(m11);
    extract_fast(p7);
    p8 = c0 + m12;
    VERIFY_CHECK(p8 <= 2);

    /* Reduce 258 bits into 256. */
    /* r[0..7] = p[0..7] + p[8] * SECP256K1_N_C. */
    c = p0 + (uint64_t)SECP256K1_N_C_0 * p8;
    r->d[0] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p1 + (uint64_t)SECP256K1_N_C_1 * p8;
    r->d[1] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p2 + (uint64_t)SECP256K1_N_C_2 * p8;
    r->d[2] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p3 + (uint64_t)SECP256K1_N_C_3 * p8;
    r->d[3] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p4 + (uint64_t)p8;
    r->d[4] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p5;
    r->d[5] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p6;
    r->d[6] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p7;
    r->d[7] = c & 0xFFFFFFFFUL; c >>= 32;

    /* Final reduction of r. */
    secp256k1_scalar_reduce(r, c + secp256k1_scalar_check_overflow(r));
}